

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLUri::serialize(XMLUri *this,XSerializeEngine *serEng)

{
  bool bVar1;
  XSerializeEngine *serEng_local;
  XMLUri *this_local;
  
  bVar1 = XSerializeEngine::isStoring(serEng);
  if (bVar1) {
    XSerializeEngine::operator<<(serEng,this->fPort);
    XSerializeEngine::writeString(serEng,this->fScheme,0,false);
    XSerializeEngine::writeString(serEng,this->fUserInfo,0,false);
    XSerializeEngine::writeString(serEng,this->fHost,0,false);
    XSerializeEngine::writeString(serEng,this->fRegAuth,0,false);
    XSerializeEngine::writeString(serEng,this->fPath,0,false);
    XSerializeEngine::writeString(serEng,this->fQueryString,0,false);
    XSerializeEngine::writeString(serEng,this->fFragment,0,false);
    XSerializeEngine::writeString(serEng,this->fURIText,0,false);
  }
  else {
    XSerializeEngine::operator>>(serEng,&this->fPort);
    XSerializeEngine::readString(serEng,&this->fScheme);
    XSerializeEngine::readString(serEng,&this->fUserInfo);
    XSerializeEngine::readString(serEng,&this->fHost);
    XSerializeEngine::readString(serEng,&this->fRegAuth);
    XSerializeEngine::readString(serEng,&this->fPath);
    XSerializeEngine::readString(serEng,&this->fQueryString);
    XSerializeEngine::readString(serEng,&this->fFragment);
    XSerializeEngine::readString(serEng,&this->fURIText);
  }
  return;
}

Assistant:

void XMLUri::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {
        serEng<<fPort;
        serEng.writeString(fScheme);
        serEng.writeString(fUserInfo);
        serEng.writeString(fHost);
        serEng.writeString(fRegAuth);
        serEng.writeString(fPath);
        serEng.writeString(fQueryString);
        serEng.writeString(fFragment);
        serEng.writeString(fURIText);
    }
    else
    {
        serEng>>fPort;
        serEng.readString(fScheme);
        serEng.readString(fUserInfo);
        serEng.readString(fHost);
        serEng.readString(fRegAuth);
        serEng.readString(fPath);
        serEng.readString(fQueryString);
        serEng.readString(fFragment);
        serEng.readString(fURIText);
    }

}